

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_globals.cpp
# Opt level: O3

GOs __thiscall
Omega_h::rescan_globals<signed_char>(Omega_h *this,Mesh *mesh,Read<signed_char> *counts)

{
  Comm *pCVar1;
  int *piVar2;
  Alloc *pAVar3;
  undefined8 uVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  void *extraout_RDX;
  LO LVar8;
  Alloc *pAVar9;
  GOs GVar10;
  ScopedTimer omega_h_scoped_function_timer;
  type f;
  LOs local_offsets;
  Write<long> new_globals_w;
  string __str;
  ScopedTimer local_e1;
  undefined1 local_e0 [32];
  long local_c0;
  Read<int> local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  void *local_60;
  Alloc *local_58 [2];
  Write<long> local_48;
  Alloc *local_38;
  
  local_98._0_8_ = (Alloc *)local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_globals.cpp"
             ,"");
  plVar6 = (long *)std::__cxx11::string::append(local_98);
  pAVar9 = (Alloc *)(plVar6 + 2);
  if ((Alloc *)*plVar6 == pAVar9) {
    local_a8._0_8_ = pAVar9->size;
    local_a8._8_8_ = plVar6[3];
    local_b8.write_.shared_alloc_.alloc = (Alloc *)local_a8;
  }
  else {
    local_a8._0_8_ = pAVar9->size;
    local_b8.write_.shared_alloc_.alloc = (Alloc *)*plVar6;
  }
  local_b8.write_.shared_alloc_.direct_ptr = (void *)plVar6[1];
  *plVar6 = (long)pAVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_70._8_8_ = local_58;
  std::__cxx11::string::_M_construct((long)&local_70 + 8,'\x02');
  *(undefined2 *)local_70._8_8_ = 0x3031;
  pAVar9 = (Alloc *)0xf;
  if (local_b8.write_.shared_alloc_.alloc != (Alloc *)local_a8) {
    pAVar9 = (Alloc *)local_a8._0_8_;
  }
  if (pAVar9 < (Alloc *)((long)local_60 + (long)local_b8.write_.shared_alloc_.direct_ptr)) {
    pAVar9 = (Alloc *)0xf;
    if ((Alloc **)local_70._8_8_ != local_58) {
      pAVar9 = local_58[0];
    }
    if ((Alloc *)((long)local_60 + (long)local_b8.write_.shared_alloc_.direct_ptr) <= pAVar9) {
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((long)&local_70 + 8,0,(char *)0x0,
                                  (ulong)local_b8.write_.shared_alloc_.alloc);
      goto LAB_002cff7a;
    }
  }
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,local_70._8_8_);
LAB_002cff7a:
  local_e0._0_8_ = local_e0 + 0x10;
  pCVar1 = (Comm *)(plVar6 + 2);
  if ((Comm *)*plVar6 == pCVar1) {
    local_e0._16_8_ = pCVar1->library_;
    local_e0._24_8_ = plVar6[3];
  }
  else {
    local_e0._16_8_ = pCVar1->library_;
    local_e0._0_8_ = (Comm *)*plVar6;
  }
  local_e0._8_8_ = plVar6[1];
  *plVar6 = (long)pCVar1;
  plVar6[1] = 0;
  *(undefined1 *)&pCVar1->library_ = 0;
  local_38 = (Alloc *)this;
  begin_code("rescan_globals",(char *)local_e0._0_8_);
  pCVar1 = (Comm *)(local_e0 + 0x10);
  if ((Comm *)local_e0._0_8_ != pCVar1) {
    operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
  }
  if ((Alloc **)local_70._8_8_ != local_58) {
    operator_delete((void *)local_70._8_8_,(ulong)((long)&local_58[0]->size + 1));
  }
  if (local_b8.write_.shared_alloc_.alloc != (Alloc *)local_a8) {
    operator_delete(local_b8.write_.shared_alloc_.alloc,(ulong)((long)(size_t *)local_a8._0_8_ + 1))
    ;
  }
  if ((Alloc *)local_98._0_8_ != (Alloc *)local_88) {
    operator_delete((void *)local_98._0_8_,local_88._0_8_ + 1);
  }
  local_88._16_8_ = (counts->write_).shared_alloc_.alloc;
  if ((local_88._16_8_ & 7) == 0 && (Alloc *)local_88._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88._16_8_ = ((Alloc *)local_88._16_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_88._16_8_)->use_count = ((Alloc *)local_88._16_8_)->use_count + 1;
    }
  }
  local_70._M_allocated_capacity = (size_type)(counts->write_).shared_alloc_.direct_ptr;
  local_e0._0_8_ = pCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"");
  offset_scan<signed_char>
            ((Omega_h *)&local_b8,(Read<signed_char> *)(local_88 + 0x10),(string *)local_e0);
  if ((Comm *)local_e0._0_8_ != pCVar1) {
    operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
  }
  uVar4 = local_88._16_8_;
  if ((local_88._16_8_ & 7) == 0 && (Alloc *)local_88._16_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_88._16_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_88._16_8_);
      operator_delete((void *)uVar4,0x48);
    }
  }
  iVar5 = Read<int>::last(&local_b8);
  Mesh::comm(mesh);
  lVar7 = Comm::exscan<long>((Comm *)local_e0._0_8_,(long)iVar5,OMEGA_H_SUM);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
  }
  pAVar9 = (counts->write_).shared_alloc_.alloc;
  if (((ulong)pAVar9 & 1) == 0) {
    LVar8 = (LO)pAVar9->size;
  }
  else {
    LVar8 = (LO)((ulong)pAVar9 >> 3);
  }
  local_e0._0_8_ = pCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"");
  Write<long>::Write((Write<long> *)local_98,LVar8,(string *)local_e0);
  if ((Comm *)local_e0._0_8_ != pCVar1) {
    operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
  }
  pAVar9 = local_38;
  local_e0._0_8_ = local_98._0_8_;
  if ((local_98._0_8_ & 7) == 0 && (Alloc *)local_98._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0._0_8_ = *(size_t *)local_98._0_8_ * 8 + 1;
    }
    else {
      *(int *)(local_98._0_8_ + 0x30) = *(int *)(local_98._0_8_ + 0x30) + 1;
    }
  }
  local_e0._8_8_ = local_98._8_8_;
  local_e0._16_8_ = local_b8.write_.shared_alloc_.alloc;
  if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0._16_8_ = (local_b8.write_.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_b8.write_.shared_alloc_.alloc)->use_count =
           (local_b8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_e0._24_8_ = local_b8.write_.shared_alloc_.direct_ptr;
  pAVar3 = (counts->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    LVar8 = (LO)pAVar3->size;
  }
  else {
    LVar8 = (LO)((ulong)pAVar3 >> 3);
  }
  local_c0 = lVar7;
  parallel_for<Omega_h::rescan_globals<signed_char>(Omega_h::Mesh*,Omega_h::Read<signed_char>)::_lambda(int)_1_>
            (LVar8,(type *)local_e0);
  local_48.shared_alloc_.alloc = (Alloc *)local_98._0_8_;
  if ((local_98._0_8_ & 7) == 0 && (Alloc *)local_98._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_98._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_98._0_8_ + 0x30) = *(int *)(local_98._0_8_ + 0x30) + 1;
    }
  }
  local_48.shared_alloc_.direct_ptr = (void *)local_98._8_8_;
  Read<long>::Read((Read<signed_char> *)pAVar9,&local_48);
  pAVar3 = local_48.shared_alloc_.alloc;
  if (((ulong)local_48.shared_alloc_.alloc & 7) == 0 && local_48.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_48.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar3);
      operator_delete(pAVar3,0x48);
    }
  }
  uVar4 = local_e0._16_8_;
  if ((local_e0._16_8_ & 7) == 0 && (Alloc *)local_e0._16_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_e0._16_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_e0._16_8_);
      operator_delete((void *)uVar4,0x48);
    }
  }
  uVar4 = local_e0._0_8_;
  if ((local_e0._0_8_ & 7) == 0 && (Alloc *)local_e0._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_e0._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_e0._0_8_);
      operator_delete((void *)uVar4,0x48);
    }
  }
  uVar4 = local_98._0_8_;
  if ((local_98._0_8_ & 7) == 0 && (Alloc *)local_98._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_98._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_98._0_8_);
      operator_delete((void *)uVar4,0x48);
    }
  }
  pAVar3 = local_b8.write_.shared_alloc_.alloc;
  if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_b8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_e1);
  GVar10.write_.shared_alloc_.direct_ptr = extraout_RDX;
  GVar10.write_.shared_alloc_.alloc = pAVar9;
  return (GOs)GVar10.write_.shared_alloc_;
}

Assistant:

GOs rescan_globals(Mesh* mesh, Read<T> counts) {
  OMEGA_H_TIME_FUNCTION;
  auto const local_offsets = offset_scan(counts);
  auto const nnew = local_offsets.last();
  auto const start = mesh->comm()->exscan(GO(nnew), OMEGA_H_SUM);
  auto const new_globals_w = Write<GO>(counts.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    new_globals_w[i] = local_offsets[i] + start;
  };
  parallel_for(counts.size(), std::move(f));
  return new_globals_w;
}